

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t joint_strength_search
                   (int *best_lev,int nb_strengths,uint64_t (*mse) [64],int sb_count,
                   CDEF_PICK_METHOD pick_method)

{
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int j;
  int i;
  int fast;
  uint64_t best_tot_mse;
  CDEF_PICK_METHOD in_stack_000001f8;
  int in_stack_000001fc;
  uint64_t (*in_stack_00000200) [64];
  int in_stack_0000020c;
  int *in_stack_00000210;
  int local_34;
  int local_30;
  uint64_t local_28;
  
  local_28 = 0x8000000000000000;
  for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
    local_28 = search_one(in_stack_00000210,in_stack_0000020c,in_stack_00000200,in_stack_000001fc,
                          in_stack_000001f8);
  }
  if (in_R8D == 0 || 5 < in_R8D) {
    for (local_30 = 0; local_30 < in_ESI * 4; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < in_ESI + -1; local_34 = local_34 + 1) {
        *(undefined4 *)(in_RDI + (long)local_34 * 4) =
             *(undefined4 *)(in_RDI + (long)(local_34 + 1) * 4);
      }
      local_28 = search_one(in_stack_00000210,in_stack_0000020c,in_stack_00000200,in_stack_000001fc,
                            in_stack_000001f8);
    }
  }
  return local_28;
}

Assistant:

static uint64_t joint_strength_search(int *best_lev, int nb_strengths,
                                      uint64_t mse[][TOTAL_STRENGTHS],
                                      int sb_count,
                                      CDEF_PICK_METHOD pick_method) {
  uint64_t best_tot_mse;
  int fast = (pick_method >= CDEF_FAST_SEARCH_LVL1 &&
              pick_method <= CDEF_FAST_SEARCH_LVL5);
  int i;
  best_tot_mse = (uint64_t)1 << 63;
  /* Greedy search: add one strength options at a time. */
  for (i = 0; i < nb_strengths; i++) {
    best_tot_mse = search_one(best_lev, i, mse, sb_count, pick_method);
  }
  /* Trying to refine the greedy search by reconsidering each
     already-selected option. */
  if (!fast) {
    for (i = 0; i < 4 * nb_strengths; i++) {
      int j;
      for (j = 0; j < nb_strengths - 1; j++) best_lev[j] = best_lev[j + 1];
      best_tot_mse =
          search_one(best_lev, nb_strengths - 1, mse, sb_count, pick_method);
    }
  }
  return best_tot_mse;
}